

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_util.cpp
# Opt level: O3

vector<libtorrent::aux::listen_interface_t,_std::allocator<libtorrent::aux::listen_interface_t>_> *
libtorrent::aux::parse_listen_interfaces
          (vector<libtorrent::aux::listen_interface_t,_std::allocator<libtorrent::aux::listen_interface_t>_>
           *__return_storage_ptr__,string *in,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *err)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ulong uVar2;
  void *pvVar3;
  aux *paVar4;
  size_t sVar5;
  pointer pcVar6;
  char *pcVar7;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  char *extraout_RDX_02;
  char *extraout_RDX_03;
  char *extraout_RDX_04;
  size_t in_R8;
  aux *this;
  size_t sVar8;
  size_type __rlen;
  long lVar9;
  aux *paVar10;
  string_view in_00;
  string_view in_01;
  string_view in_02;
  string_view in_03;
  string_view sVar11;
  string_view last;
  listen_interface_t iface;
  string port_str;
  basic_string_view<char,_std::char_traits<char>_> local_a8;
  vector<libtorrent::aux::listen_interface_t,std::allocator<libtorrent::aux::listen_interface_t>>
  *local_90;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_88;
  listen_interface_t local_80;
  char *local_58;
  long local_50;
  char local_48;
  undefined7 uStack_47;
  pointer local_38;
  char *extraout_RDX;
  
  (__return_storage_ptr__->
  super__Vector_base<libtorrent::aux::listen_interface_t,_std::allocator<libtorrent::aux::listen_interface_t>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<libtorrent::aux::listen_interface_t,_std::allocator<libtorrent::aux::listen_interface_t>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<libtorrent::aux::listen_interface_t,_std::allocator<libtorrent::aux::listen_interface_t>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this = (aux *)in->_M_string_length;
  local_90 = (vector<libtorrent::aux::listen_interface_t,std::allocator<libtorrent::aux::listen_interface_t>>
              *)__return_storage_ptr__;
  if (this != (aux *)0x0) {
    paVar1 = &local_80.device.field_2;
    pcVar6 = (in->_M_dataplus)._M_p;
    local_88 = err;
    do {
      local_a8 = (basic_string_view<char,_std::char_traits<char>_>)ZEXT816(0);
      last._M_str = (char *)0x2c;
      last._M_len = (size_t)pcVar6;
      split_string_quotes((pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
                           *)&local_80,this,last,(char)in_R8);
      local_a8._M_str = (char *)local_80.device._M_string_length;
      local_a8._M_len = (size_t)local_80.device._M_dataplus._M_p;
      this = (aux *)CONCAT71(local_80.device.field_2._M_allocated_capacity._1_7_,
                             local_80.device.field_2._M_local_buf[0]);
      local_38 = (pointer)local_80.device.field_2._8_8_;
      sVar11._M_str = extraout_RDX;
      sVar11._M_len = local_80.device._M_string_length;
      local_a8 = (basic_string_view<char,_std::char_traits<char>_>)
                 strip_string((aux *)local_80.device._M_dataplus._M_p,sVar11);
      pcVar7 = local_a8._M_str;
      uVar2 = local_a8._M_len;
      if (uVar2 < 2) {
LAB_00307b5c:
        if (local_a8._M_len != 0) goto LAB_00307b65;
      }
      else {
        if ((*pcVar7 == '\"') && (pcVar7[uVar2 - 1] == '\"')) {
          local_a8._M_str = pcVar7 + 1;
          local_a8._M_len = uVar2 - 2;
          goto LAB_00307b5c;
        }
LAB_00307b65:
        pcVar7 = local_a8._M_str;
        paVar10 = (aux *)local_a8._M_len;
        local_80.device._M_string_length = 0;
        local_80.device.field_2._M_local_buf[0] = '\0';
        local_80.ssl = false;
        local_80.local = false;
        local_80.device._M_dataplus._M_p = (pointer)paVar1;
        if (*pcVar7 == '[') {
          pvVar3 = memchr(pcVar7,0x5d,(size_t)paVar10);
          lVar9 = (long)pvVar3 - (long)pcVar7;
          if (((lVar9 == -1 || pvVar3 == (void *)0x0) || (paVar10 <= (aux *)(lVar9 + 1U))) ||
             (pcVar7[(long)(lVar9 + 1U)] != ':')) {
            ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::basic_string_view<char,std::char_traits<char>>&>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_88
                       ,&local_a8);
          }
          else {
            paVar4 = paVar10 + -1;
            if ((aux *)(lVar9 - 1U) <= paVar10 + -1) {
              paVar4 = (aux *)(lVar9 - 1U);
            }
            in_00._M_str = extraout_RDX_00;
            in_00._M_len = (size_t)(pcVar7 + 1);
            sVar11 = strip_string(paVar4,in_00);
            in_R8 = sVar11._M_len;
            ::std::__cxx11::string::_M_replace((ulong)&local_80,0,(char *)0x0,(ulong)sVar11._M_str);
            paVar10 = (aux *)(lVar9 + 2);
            paVar4 = (aux *)(local_a8._M_len + -(long)paVar10);
            pcVar7 = extraout_RDX_01;
            if (local_a8._M_len < paVar10) {
              ::std::__throw_out_of_range_fmt
                        ("%s: __pos (which is %zu) > __size (which is %zu)",
                         "basic_string_view::substr",paVar10);
            }
LAB_00307c80:
            in_02._M_str = pcVar7;
            in_02._M_len = (size_t)(paVar10 + (long)local_a8._M_str);
            sVar11 = strip_string(paVar4,in_02);
            sVar5 = sVar11._M_len;
            local_58 = &local_48;
            local_50 = 0;
            local_48 = '\0';
            if (sVar5 == 0) {
LAB_00307cfb:
              ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              emplace_back<std::basic_string_view<char,std::char_traits<char>>&>
                        ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                         local_88,&local_a8);
            }
            else {
              sVar8 = 0;
              do {
                if (9 < (byte)(sVar11._M_str[sVar8] - 0x30U)) break;
                ::std::__cxx11::string::push_back((char)&local_58);
                sVar8 = sVar8 + 1;
              } while (sVar5 != sVar8);
              lVar9 = local_50;
              if ((local_50 - 6U < 0xfffffffffffffffb) ||
                 (local_80.port = atoi(local_58), 0xffff < (uint)local_80.port)) goto LAB_00307cfb;
              in_03._M_str = extraout_RDX_04;
              in_03._M_len = (size_t)(sVar11._M_str + lVar9);
              sVar11 = strip_string((aux *)(sVar5 - lVar9),in_03);
              if (sVar11._M_len != 0) {
                sVar5 = 0;
                do {
                  if (sVar11._M_str[sVar5] == 'l') {
                    local_80.local = true;
                  }
                  else if (sVar11._M_str[sVar5] == 's') {
                    local_80.ssl = true;
                  }
                  sVar5 = sVar5 + 1;
                } while (sVar11._M_len != sVar5);
              }
              ::std::
              vector<libtorrent::aux::listen_interface_t,std::allocator<libtorrent::aux::listen_interface_t>>
              ::emplace_back<libtorrent::aux::listen_interface_t&>(local_90,&local_80);
            }
            if (local_58 != &local_48) {
              operator_delete(local_58,CONCAT71(uStack_47,local_48) + 1);
            }
          }
        }
        else {
          pvVar3 = memchr(pcVar7,0x3a,(size_t)paVar10);
          paVar4 = (aux *)(-(ulong)(pvVar3 == (void *)0x0) | (long)pvVar3 - (long)pcVar7);
          if (paVar4 <= paVar10) {
            paVar10 = paVar4;
          }
          in_01._M_str = extraout_RDX_02;
          in_01._M_len = (size_t)pcVar7;
          sVar11 = strip_string(paVar10,in_01);
          in_R8 = sVar11._M_len;
          ::std::__cxx11::string::_M_replace((ulong)&local_80,0,(char *)0x0,(ulong)sVar11._M_str);
          if (paVar4 != (aux *)0xffffffffffffffff) {
            paVar10 = paVar4 + 1;
            if (local_a8._M_len <= paVar4) {
              ::std::__throw_out_of_range_fmt
                        ("%s: __pos (which is %zu) > __size (which is %zu)",
                         "basic_string_view::substr",paVar10,local_a8._M_len);
            }
            paVar4 = (aux *)(local_a8._M_len + -(long)paVar10);
            pcVar7 = extraout_RDX_03;
            goto LAB_00307c80;
          }
          ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::basic_string_view<char,std::char_traits<char>>&>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_88,
                     &local_a8);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80.device._M_dataplus._M_p != paVar1) {
          operator_delete(local_80.device._M_dataplus._M_p,
                          CONCAT71(local_80.device.field_2._M_allocated_capacity._1_7_,
                                   local_80.device.field_2._M_local_buf[0]) + 1);
        }
      }
      pcVar6 = local_38;
    } while (this != (aux *)0x0);
  }
  return (vector<libtorrent::aux::listen_interface_t,_std::allocator<libtorrent::aux::listen_interface_t>_>
          *)local_90;
}

Assistant:

std::vector<listen_interface_t> parse_listen_interfaces(std::string const& in
		, std::vector<std::string>& err)
	{
		std::vector<listen_interface_t> out;

		string_view rest = in;
		while (!rest.empty())
		{
			string_view element;
			std::tie(element, rest) = split_string_quotes(rest, ',');

			element = strip_string(element);
			if (element.size() > 1 && element.front() == '"' && element.back() == '"')
				element = element.substr(1, element.size() - 2);
			if (element.empty()) continue;

			listen_interface_t iface;
			iface.ssl = false;
			iface.local = false;

			string_view port;
			if (element.front() == '[')
			{
				auto const pos = element.find_first_of(']', 0);
				if (pos == string_view::npos
					|| pos+1 >= element.size()
					|| element[pos+1] != ':')
				{
					err.emplace_back(element);
					continue;
				}

				iface.device = strip_string(element.substr(1, pos - 1));

				port = strip_string(element.substr(pos + 2));
			}
			else
			{
				// consume device name
				auto const pos = element.find_first_of(':', 0);
				iface.device = strip_string(element.substr(0, pos));
				if (pos == string_view::npos)
				{
					err.emplace_back(element);
					continue;
				}
				port = strip_string(element.substr(pos + 1));
			}

			// consume port
			std::string port_str;
			for (std::size_t i = 0; i < port.size() && is_digit(port[i]); ++i)
				port_str += port[i];

			if (port_str.empty() || port_str.size() > 5)
			{
				err.emplace_back(element);
				continue;
			}

			iface.port = std::atoi(port_str.c_str());
			if (iface.port < 0 || iface.port > 65535)
			{
				err.emplace_back(element);
				continue;
			}

			port.remove_prefix(port_str.size());
			port = strip_string(port);

			// consume potential SSL 's'
			for (auto const c : port)
			{
				switch (c)
				{
					case 's': iface.ssl = true; break;
					case 'l': iface.local = true; break;
				}
			}

			TORRENT_ASSERT(iface.port >= 0);
			out.emplace_back(iface);
		}

		return out;
	}